

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

DefinitionSymbol * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  group_type_pointer pgVar1;
  char *pcVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  DefinitionSymbol *pDVar5;
  RootSymbol *pRVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*> *ppVar14;
  uint uVar15;
  Scope *pSVar16;
  value_type *elements_1;
  ulong uVar17;
  ulong uVar18;
  long *plVar19;
  ulong uVar20;
  uchar uVar21;
  char cVar22;
  uchar uVar23;
  char cVar24;
  uchar uVar25;
  char cVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Scope *insertScope;
  SmallMap<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*,_4UL,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
  scopeMap;
  try_emplace_args_t local_121;
  Scope *local_120;
  Scope *local_118;
  Compilation *local_110;
  long *local_108;
  locator local_100;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  byte bStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  byte bStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  byte bStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  byte bStack_d9;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  byte bStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  byte bStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  byte bStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  byte bStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  byte bStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  byte bStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  byte bStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  byte bStack_b9;
  undefined1 local_b8 [72];
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
  local_70;
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = syntax;
  uVar13 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar11 = uVar13 >> ((byte)(this->definitionFromSyntax).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar13 & 0xff];
  ppVar4 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.elements_;
  uVar18 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.groups_size_mask;
  uVar17 = 0;
  do {
    pgVar1 = (this->definitionFromSyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
             .arrays.groups_ + uVar11;
    local_c8 = pgVar1->m[0].n;
    uStack_c7 = pgVar1->m[1].n;
    uStack_c6 = pgVar1->m[2].n;
    bStack_c5 = pgVar1->m[3].n;
    uStack_c4 = pgVar1->m[4].n;
    uStack_c3 = pgVar1->m[5].n;
    uStack_c2 = pgVar1->m[6].n;
    bStack_c1 = pgVar1->m[7].n;
    uStack_c0 = pgVar1->m[8].n;
    uStack_bf = pgVar1->m[9].n;
    uStack_be = pgVar1->m[10].n;
    bStack_bd = pgVar1->m[0xb].n;
    uStack_bc = pgVar1->m[0xc].n;
    uStack_bb = pgVar1->m[0xd].n;
    uStack_ba = pgVar1->m[0xe].n;
    bStack_b9 = pgVar1->m[0xf].n;
    uVar21 = (uchar)uVar3;
    auVar28[0] = -(local_c8 == uVar21);
    uVar23 = (uchar)((uint)uVar3 >> 8);
    auVar28[1] = -(uStack_c7 == uVar23);
    uVar25 = (uchar)((uint)uVar3 >> 0x10);
    auVar28[2] = -(uStack_c6 == uVar25);
    bVar27 = (byte)((uint)uVar3 >> 0x18);
    auVar28[3] = -(bStack_c5 == bVar27);
    auVar28[4] = -(uStack_c4 == uVar21);
    auVar28[5] = -(uStack_c3 == uVar23);
    auVar28[6] = -(uStack_c2 == uVar25);
    auVar28[7] = -(bStack_c1 == bVar27);
    auVar28[8] = -(uStack_c0 == uVar21);
    auVar28[9] = -(uStack_bf == uVar23);
    auVar28[10] = -(uStack_be == uVar25);
    auVar28[0xb] = -(bStack_bd == bVar27);
    auVar28[0xc] = -(uStack_bc == uVar21);
    auVar28[0xd] = -(uStack_bb == uVar23);
    auVar28[0xe] = -(uStack_ba == uVar25);
    auVar28[0xf] = -(bStack_b9 == bVar27);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
        uVar15 = uVar15 - 1 & uVar15) {
      iVar7 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
        }
      }
      uVar20 = (ulong)(uint)(iVar7 << 5);
      if (*(ModuleDeclarationSyntax **)((long)&ppVar4[uVar11 * 0xf].first + uVar20) == syntax) {
        local_118 = scope;
        local_110 = this;
        SmallMap<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*,_4UL,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
        ::SmallMap((SmallMap<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*,_4UL,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
                    *)local_b8);
        plVar19 = *(long **)((long)&ppVar4[uVar11 * 0xf].second.
                                    super__Vector_base<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar20);
        local_108 = *(long **)((long)&ppVar4[uVar11 * 0xf].second.
                                      super__Vector_base<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + uVar20);
        goto LAB_003812ff;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bStack_b9) == 0) {
      return (DefinitionSymbol *)0x0;
    }
    lVar12 = uVar11 + uVar17;
    uVar17 = uVar17 + 1;
    uVar11 = lVar12 + 1U & uVar18;
    if (uVar18 < uVar17) {
      return (DefinitionSymbol *)0x0;
    }
  } while( true );
LAB_003812ff:
  pSVar16 = local_118;
  if (plVar19 == local_108) {
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = pSVar16;
      uVar11 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar18 = uVar11 >> ((byte)local_70.arrays.groups_size_index & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar11 & 0xff];
      uVar13 = 0;
      do {
        pcVar2 = (char *)((long)local_70.arrays.groups_ + uVar18 * 0x10);
        local_e8 = *pcVar2;
        cStack_e7 = pcVar2[1];
        cStack_e6 = pcVar2[2];
        bStack_e5 = pcVar2[3];
        cStack_e4 = pcVar2[4];
        cStack_e3 = pcVar2[5];
        cStack_e2 = pcVar2[6];
        bStack_e1 = pcVar2[7];
        cStack_e0 = pcVar2[8];
        cStack_df = pcVar2[9];
        cStack_de = pcVar2[10];
        bStack_dd = pcVar2[0xb];
        cStack_dc = pcVar2[0xc];
        cStack_db = pcVar2[0xd];
        cStack_da = pcVar2[0xe];
        bStack_d9 = pcVar2[0xf];
        cVar22 = (char)uVar3;
        auVar30[0] = -(local_e8 == cVar22);
        cVar24 = (char)((uint)uVar3 >> 8);
        auVar30[1] = -(cStack_e7 == cVar24);
        cVar26 = (char)((uint)uVar3 >> 0x10);
        auVar30[2] = -(cStack_e6 == cVar26);
        bVar27 = (byte)((uint)uVar3 >> 0x18);
        auVar30[3] = -(bStack_e5 == bVar27);
        auVar30[4] = -(cStack_e4 == cVar22);
        auVar30[5] = -(cStack_e3 == cVar24);
        auVar30[6] = -(cStack_e2 == cVar26);
        auVar30[7] = -(bStack_e1 == bVar27);
        auVar30[8] = -(cStack_e0 == cVar22);
        auVar30[9] = -(cStack_df == cVar24);
        auVar30[10] = -(cStack_de == cVar26);
        auVar30[0xb] = -(bStack_dd == bVar27);
        auVar30[0xc] = -(cStack_dc == cVar22);
        auVar30[0xd] = -(cStack_db == cVar24);
        auVar30[0xe] = -(cStack_da == cVar26);
        auVar30[0xf] = -(bStack_d9 == bVar27);
        for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
            uVar15 = uVar15 - 1 & uVar15) {
          iVar7 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          if (pSVar16 ==
              *(Scope **)
               ((long)local_70.arrays.elements_ + uVar18 * 0xf0 + (ulong)(uint)(iVar7 << 4))) {
            pDVar5 = *(DefinitionSymbol **)
                      ((long)local_70.arrays.elements_ + uVar18 * 0xf0 + 8 +
                      (ulong)(uint)(iVar7 << 4));
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
            ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
                           *)(local_b8 + 0x48));
            return pDVar5;
          }
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bStack_d9) == 0)
        break;
        lVar12 = uVar18 + uVar13;
        uVar13 = uVar13 + 1;
        uVar18 = lVar12 + 1U & local_70.arrays.groups_size_mask;
      } while (uVar13 <= local_70.arrays.groups_size_mask);
      pSVar16 = pSVar16->thisSym->parentScope;
      if (pSVar16 == (Scope *)0x0) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
        ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
                       *)(local_b8 + 0x48));
        return (DefinitionSymbol *)0x0;
      }
    } while( true );
  }
  pDVar5 = (DefinitionSymbol *)*plVar19;
  local_120 = (pDVar5->super_Symbol).parentScope;
  if (local_120 == (Scope *)0x0) {
    pSVar16 = (Scope *)0x0;
  }
  else {
    pSVar16 = local_120;
    if ((local_120->thisSym->kind == CompilationUnit) &&
       (pRVar6 = (local_110->root)._M_t.
                 super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                 .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl,
       pSVar16 = &pRVar6->super_Scope, local_120 = pSVar16, pRVar6 == (RootSymbol *)0x0)) {
      pSVar16 = (Scope *)0x0;
      local_120 = pSVar16;
    }
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = pSVar16;
  uVar13 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar11 = uVar13 >> ((byte)local_70.arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar13 & 0xff];
  uVar17 = 0;
  uVar18 = uVar11;
  do {
    pcVar2 = (char *)((long)local_70.arrays.groups_ + uVar18 * 0x10);
    local_d8 = *pcVar2;
    cStack_d7 = pcVar2[1];
    cStack_d6 = pcVar2[2];
    bStack_d5 = pcVar2[3];
    cStack_d4 = pcVar2[4];
    cStack_d3 = pcVar2[5];
    cStack_d2 = pcVar2[6];
    bStack_d1 = pcVar2[7];
    cStack_d0 = pcVar2[8];
    cStack_cf = pcVar2[9];
    cStack_ce = pcVar2[10];
    bStack_cd = pcVar2[0xb];
    cStack_cc = pcVar2[0xc];
    cStack_cb = pcVar2[0xd];
    cStack_ca = pcVar2[0xe];
    bStack_c9 = pcVar2[0xf];
    cVar22 = (char)uVar3;
    auVar29[0] = -(local_d8 == cVar22);
    cVar24 = (char)((uint)uVar3 >> 8);
    auVar29[1] = -(cStack_d7 == cVar24);
    cVar26 = (char)((uint)uVar3 >> 0x10);
    auVar29[2] = -(cStack_d6 == cVar26);
    bVar27 = (byte)((uint)uVar3 >> 0x18);
    auVar29[3] = -(bStack_d5 == bVar27);
    auVar29[4] = -(cStack_d4 == cVar22);
    auVar29[5] = -(cStack_d3 == cVar24);
    auVar29[6] = -(cStack_d2 == cVar26);
    auVar29[7] = -(bStack_d1 == bVar27);
    auVar29[8] = -(cStack_d0 == cVar22);
    auVar29[9] = -(cStack_cf == cVar24);
    auVar29[10] = -(cStack_ce == cVar26);
    auVar29[0xb] = -(bStack_cd == bVar27);
    auVar29[0xc] = -(cStack_cc == cVar22);
    auVar29[0xd] = -(cStack_cb == cVar24);
    auVar29[0xe] = -(cStack_ca == cVar26);
    auVar29[0xf] = -(bStack_c9 == bVar27);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
        uVar15 = uVar15 - 1 & uVar15) {
      iVar7 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
        }
      }
      if (pSVar16 ==
          *(Scope **)((long)local_70.arrays.elements_ + uVar18 * 0xf0 + (ulong)(uint)(iVar7 << 4)))
      {
        ppVar14 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*> *)
                  ((long)local_70.arrays.elements_ + uVar18 * 0xf0 + (ulong)(uint)(iVar7 << 4));
        goto LAB_0038144f;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bStack_c9) == 0) break;
    lVar12 = uVar18 + uVar17;
    uVar17 = uVar17 + 1;
    uVar18 = lVar12 + 1U & local_70.arrays.groups_size_mask;
  } while (uVar17 <= local_70.arrays.groups_size_mask);
  if (local_70.size_ctrl.size < local_70.size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*const&>
              (&local_100,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
                *)(local_b8 + 0x48),uVar11,uVar13,&local_121,&local_120);
    ppVar14 = local_100.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*const&>
              (&local_100,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
                *)(local_b8 + 0x48),uVar13,&local_121,&local_120);
    ppVar14 = local_100.p;
  }
LAB_0038144f:
  ppVar14->second = pDVar5;
  plVar19 = plVar19 + 1;
  goto LAB_003812ff;
}

Assistant:

const DefinitionSymbol* Compilation::getDefinition(const Scope& scope,
                                                   const ModuleDeclarationSyntax& syntax) const {
    if (auto it = definitionFromSyntax.find(&syntax); it != definitionFromSyntax.end()) {
        SmallMap<const Scope*, const DefinitionSymbol*, 4> scopeMap;
        for (auto def : it->second) {
            auto insertScope = def->getParentScope();
            if (insertScope && insertScope->asSymbol().kind == SymbolKind::CompilationUnit)
                insertScope = root.get();

            scopeMap[insertScope] = def;
        }

        auto lookupScope = &scope;
        do {
            if (auto scopeIt = scopeMap.find(lookupScope); scopeIt != scopeMap.end())
                return scopeIt->second;

            lookupScope = lookupScope->asSymbol().getParentScope();
        } while (lookupScope);
    }
    return nullptr;
}